

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildDualProblem(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *dualLP,SPxRowId *primalRowIds,SPxColId *primalColIds,SPxRowId *dualRowIds,
                  SPxColId *dualColIds,int *nprimalrows,int *nprimalcols,int *ndualrows,
                  int *ndualcols)

{
  type_conflict5 tVar1;
  bool bVar2;
  SPxSense SVar3;
  int iVar4;
  Type TVar5;
  SPxRowId *pSVar6;
  SPxColId *pSVar7;
  SPxRowId *pSVar8;
  SPxColId *pSVar9;
  ulong *puVar10;
  element_type *peVar11;
  undefined8 uVar12;
  DataKey DVar13;
  SPxColId *in_RCX;
  SPxRowId *in_RDX;
  long *in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SPxRowId *in_R8;
  SPxColId *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int primalcolsidx;
  int primalrowsidx;
  int numVarBoundCols;
  int numAddedRows;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  col;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualcols;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualrows;
  int numdualcols;
  int numdualrows;
  int numprimalcols;
  int numprimalrows;
  DataArray<soplex::SPxColId> dualcolids;
  DataArray<soplex::SPxRowId> dualrowids;
  DataArray<soplex::SPxColId> primalcolids;
  DataArray<soplex::SPxRowId> primalrowids;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffb718;
  int iVar14;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffb720;
  DataArray<soplex::SPxColId> *this_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffb728;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffb730;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffb738;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffb740;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffb748;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffb750;
  allocator *paVar15;
  double in_stack_ffffffffffffb810;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffb818;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffb820;
  type_conflict5 local_45f2;
  int local_4590;
  allocator local_4589;
  string local_4588 [36];
  undefined4 local_4564;
  undefined1 local_4560 [128];
  ulong local_44e0;
  undefined1 local_44d4 [128];
  DataKey local_4454;
  undefined4 local_444c;
  undefined1 local_4448 [128];
  undefined8 local_43c8;
  undefined1 local_43bc [128];
  undefined4 local_433c;
  undefined8 local_4338;
  undefined1 local_4330 [128];
  ulong local_42b0;
  undefined1 local_42a4 [128];
  DataKey local_4224;
  undefined4 local_421c;
  undefined8 local_4218;
  undefined1 local_4210 [128];
  ulong local_4190;
  undefined1 local_4184 [128];
  undefined4 local_4104;
  undefined1 local_4100 [128];
  undefined8 local_4080;
  undefined1 local_4074 [128];
  DataKey local_3ff4;
  undefined4 local_3fec;
  undefined1 local_3fe8 [128];
  undefined8 local_3f68;
  undefined1 local_3f5c [128];
  DataKey local_3edc;
  undefined4 local_3ed4;
  undefined8 local_3ed0;
  undefined1 local_3ec8 [128];
  ulong local_3e48;
  undefined1 local_3e3c [128];
  DataKey local_3dbc;
  undefined4 local_3db4;
  undefined8 local_3db0;
  undefined1 local_3da8 [128];
  ulong local_3d28;
  undefined1 local_3d1c [128];
  DataKey local_3c9c;
  undefined4 local_3c94;
  undefined1 local_3c90 [128];
  undefined8 local_3c10;
  undefined1 local_3c08 [128];
  DataKey local_3b88;
  int local_3b80;
  DataKey local_3b7c;
  int local_3b74;
  undefined4 local_3b70;
  undefined4 local_3b6c;
  undefined1 local_3b68 [128];
  ulong local_3ae8;
  undefined1 local_3ae0 [128];
  undefined4 local_3a60;
  undefined1 local_3a5c [128];
  undefined4 local_39dc;
  undefined1 local_39d8 [128];
  undefined8 local_3958;
  undefined1 local_394c [128];
  undefined4 local_38cc;
  undefined4 local_38c8;
  undefined1 local_38c4 [384];
  undefined4 local_3744;
  undefined1 local_3740 [128];
  undefined8 local_36c0;
  undefined1 local_36b4 [128];
  undefined4 local_3634;
  undefined8 local_3630;
  undefined1 local_3628 [128];
  ulong local_35a8;
  undefined1 local_359c [128];
  undefined4 local_351c;
  undefined8 local_3518;
  undefined1 local_3510 [128];
  ulong local_3490;
  undefined1 local_3484 [128];
  undefined4 local_3404;
  undefined1 local_3400 [128];
  undefined8 local_3380;
  undefined1 local_3378 [128];
  undefined8 local_32f8;
  undefined1 local_32ec [128];
  undefined4 local_326c;
  undefined4 local_3268;
  undefined1 local_3264 [384];
  undefined4 local_30e4;
  undefined8 local_30e0;
  undefined1 local_30d8 [128];
  ulong local_3058;
  undefined1 local_3050 [128];
  undefined4 local_2fd0;
  undefined4 local_2fcc;
  undefined1 local_2fc8 [256];
  ulong local_2ec8;
  undefined1 local_2ebc [128];
  undefined4 local_2e3c;
  undefined1 local_2e38 [128];
  undefined8 local_2db8;
  undefined1 local_2db0 [128];
  undefined4 local_2d30;
  undefined4 local_2d2c;
  undefined1 local_2d28 [128];
  undefined1 local_2ca8 [256];
  undefined8 local_2ba8;
  undefined1 local_2ba0 [148];
  undefined1 local_2b0c [128];
  undefined4 local_2a8c;
  undefined1 local_2a88 [128];
  undefined8 local_2a08;
  undefined1 local_29fc [128];
  undefined4 local_297c;
  undefined4 local_2978;
  undefined1 local_2974 [128];
  undefined1 local_28f4 [256];
  undefined4 local_27f4;
  undefined8 local_27f0;
  undefined1 local_27e8 [128];
  ulong local_2768;
  undefined1 local_2760 [128];
  undefined4 local_26e0;
  undefined4 local_26dc;
  undefined1 local_26d8 [256];
  ulong local_25d8;
  undefined1 local_25d0 [128];
  undefined8 local_2550;
  undefined1 local_2548 [144];
  undefined1 local_24b8 [148];
  undefined1 local_2424 [128];
  undefined1 local_23a4 [128];
  undefined4 local_2324;
  undefined8 local_2320;
  undefined1 local_2318 [128];
  ulong local_2298;
  undefined1 local_228c [128];
  undefined4 local_220c;
  undefined4 local_2208;
  undefined1 local_2204 [384];
  undefined4 local_2084;
  undefined1 local_2080 [128];
  undefined8 local_2000;
  undefined1 local_1ff8 [128];
  undefined4 local_1f78;
  undefined4 local_1f74;
  undefined1 local_1f70 [384];
  undefined8 local_1df0;
  undefined1 local_1de8 [128];
  undefined4 local_1d68;
  undefined4 local_1d64;
  undefined1 local_1d60 [128];
  undefined1 local_1ce0 [256];
  undefined4 local_1be0;
  undefined4 local_1bdc;
  undefined1 local_1bd8 [256];
  ulong local_1ad8;
  undefined1 local_1ad0 [148];
  undefined1 local_1a3c [128];
  undefined1 local_19bc [128];
  undefined4 local_193c;
  undefined1 local_1938 [128];
  undefined8 local_18b8;
  undefined1 local_18ac [128];
  undefined4 local_182c;
  undefined4 local_1828;
  undefined1 local_1824 [384];
  undefined4 local_16a4;
  undefined8 local_16a0;
  undefined1 local_1698 [128];
  ulong local_1618;
  undefined1 local_1610 [128];
  undefined4 local_1590;
  undefined4 local_158c;
  undefined1 local_1588 [384];
  undefined8 local_1408;
  undefined1 local_1400 [128];
  undefined4 local_1380;
  undefined4 local_137c;
  undefined1 local_1378 [256];
  ulong local_1278;
  undefined1 local_1270 [128];
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined1 local_11e8 [128];
  undefined1 local_1168 [272];
  undefined1 local_1058 [128];
  ulong local_fd8;
  undefined1 local_fd0 [128];
  undefined4 local_f50;
  undefined4 local_f4c;
  undefined1 local_f48 [384];
  undefined1 local_dc8 [128];
  ulong local_d48;
  undefined1 local_d3c [128];
  DataKey local_cbc;
  int local_cb4;
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  undefined1 local_c80 [200];
  undefined1 local_bb8 [200];
  int local_af0;
  int local_aec;
  undefined1 local_ae8 [32];
  DataArray<soplex::SPxRowId> local_ac8;
  DataArray<soplex::SPxColId> local_aa0;
  DataArray<soplex::SPxRowId> local_a88;
  SPxColId *local_a70;
  SPxRowId *local_a68;
  SPxColId *local_a60;
  SPxRowId *local_a58;
  long *local_a50;
  undefined8 local_a40;
  ulong *local_a38;
  undefined1 *local_a30;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined1 *local_a18;
  undefined8 local_a10;
  ulong *local_a08;
  undefined1 *local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined1 *local_9e8;
  undefined8 local_9e0;
  ulong *local_9d8;
  undefined1 *local_9d0;
  undefined8 local_9c8;
  undefined8 *local_9c0;
  undefined1 *local_9b8;
  undefined8 local_9b0;
  ulong *local_9a8;
  undefined1 *local_9a0;
  undefined8 local_998;
  undefined8 *local_990;
  undefined1 *local_988;
  undefined8 local_980;
  undefined8 *local_978;
  undefined1 *local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined1 *local_958;
  undefined8 local_950;
  undefined8 local_948;
  undefined1 *local_940;
  undefined8 local_938;
  ulong *local_930;
  undefined1 *local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined1 *local_910;
  undefined8 local_908;
  undefined8 *local_900;
  undefined1 *local_8f8;
  undefined8 local_8f0;
  undefined8 *local_8e8;
  undefined1 *local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined1 *local_8c8;
  undefined8 local_8c0;
  ulong *local_8b8;
  undefined1 *local_8b0;
  undefined8 local_8a8;
  undefined8 *local_8a0;
  undefined1 *local_898;
  undefined8 local_890;
  undefined8 *local_888;
  undefined1 *local_880;
  undefined8 local_878;
  ulong *local_870;
  undefined1 *local_868;
  undefined8 local_860;
  ulong *local_858;
  undefined1 *local_850;
  undefined8 local_848;
  undefined8 *local_840;
  undefined1 *local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined1 *local_820;
  undefined8 local_818;
  undefined8 *local_810;
  undefined1 *local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined8 *local_7e0;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  undefined8 *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined1 *local_790;
  undefined8 local_788;
  ulong *local_780;
  undefined1 *local_778;
  undefined8 local_770;
  ulong *local_768;
  undefined1 *local_760;
  undefined8 local_758;
  undefined8 *local_750;
  undefined1 *local_748;
  undefined8 local_740;
  undefined8 *local_738;
  undefined1 *local_730;
  undefined8 local_728;
  undefined8 *local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined1 *local_700;
  undefined8 local_6f8;
  ulong *local_6f0;
  undefined1 *local_6e8;
  undefined8 local_6e0;
  undefined8 *local_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  ulong *local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  undefined8 *local_690;
  undefined1 *local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined1 *local_670;
  undefined8 local_668;
  undefined8 *local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  ulong *local_630;
  undefined1 *local_628;
  undefined8 local_620;
  undefined8 *local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  ulong *local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 *local_5d0;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  ulong *local_5b8;
  undefined1 *local_5b0;
  undefined8 local_5a8;
  undefined8 *local_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined8 *local_588;
  undefined1 *local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined1 *local_568;
  undefined8 local_560;
  undefined8 *local_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  ulong *local_528;
  undefined1 *local_520;
  undefined8 local_518;
  undefined8 *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  ulong *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined8 *local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  ulong *local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined4 *local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined4 *local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined4 *local_438;
  undefined1 *local_430;
  undefined8 local_428;
  undefined4 *local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined4 *local_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined4 *local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined4 *local_3d8;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined4 *local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined4 *local_3a8;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined4 *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined4 *local_378;
  undefined1 *local_370;
  undefined8 local_368;
  undefined4 *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined4 *local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined4 *local_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined4 *local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined4 *local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined4 *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  undefined1 *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  undefined1 *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  undefined1 *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  undefined1 *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  undefined1 *local_280;
  undefined4 *local_278;
  undefined4 *local_270;
  undefined4 *local_268;
  undefined4 *local_260;
  undefined4 *local_258;
  undefined4 *local_250;
  undefined4 *local_248;
  undefined4 *local_240;
  undefined4 *local_238;
  undefined4 *local_230;
  undefined4 *local_228;
  undefined4 *local_220;
  undefined4 *local_218;
  undefined4 *local_210;
  undefined4 *local_208;
  undefined4 *local_200;
  undefined4 *local_1f8;
  undefined8 local_1f0;
  ulong *local_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  ulong *local_1c8;
  undefined8 *local_1c0;
  ulong *local_1b8;
  undefined8 local_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  ulong *local_188;
  undefined8 *local_180;
  ulong *local_178;
  undefined8 local_170;
  undefined8 *local_168;
  ulong *local_160;
  undefined8 local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  ulong *local_130;
  undefined8 *local_128;
  ulong *local_120;
  undefined8 local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  ulong *local_f8;
  ulong *local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  ulong *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  ulong *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  ulong *local_38;
  undefined8 *local_30;
  ulong *local_28;
  undefined8 local_20;
  ulong *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_a70 = in_R9;
  local_a68 = in_R8;
  local_a60 = in_RCX;
  local_a58 = in_RDX;
  local_a50 = in_RSI;
  if ((((in_RDX == (SPxRowId *)0x0) || (in_RCX == (SPxColId *)0x0)) || (in_R8 == (SPxRowId *)0x0))
     || (in_R9 == (SPxColId *)0x0)) {
    nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x657094);
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)in_stack_ffffffffffffb730,
               (int)((ulong)in_stack_ffffffffffffb728 >> 0x20),(int)in_stack_ffffffffffffb728,
               (Real)in_stack_ffffffffffffb720);
    nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x6570bc);
    DataArray<soplex::SPxColId>::DataArray
              ((DataArray<soplex::SPxColId> *)in_stack_ffffffffffffb730,
               (int)((ulong)in_stack_ffffffffffffb728 >> 0x20),(int)in_stack_ffffffffffffb728,
               (Real)in_stack_ffffffffffffb720);
    nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x6570f4);
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)in_stack_ffffffffffffb730,
               (int)((ulong)in_stack_ffffffffffffb728 >> 0x20),(int)in_stack_ffffffffffffb728,
               (Real)in_stack_ffffffffffffb720);
    nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x65712c);
    DataArray<soplex::SPxColId>::DataArray
              ((DataArray<soplex::SPxColId> *)in_stack_ffffffffffffb730,
               (int)((ulong)in_stack_ffffffffffffb728 >> 0x20),(int)in_stack_ffffffffffffb728,
               (Real)in_stack_ffffffffffffb720);
    local_ae8._4_4_ = 0;
    local_ae8._0_4_ = 0;
    local_aec = 0;
    local_af0 = 0;
    pSVar6 = DataArray<soplex::SPxRowId>::get_ptr(&local_a88);
    pSVar7 = DataArray<soplex::SPxColId>::get_ptr(&local_aa0);
    pSVar8 = DataArray<soplex::SPxRowId>::get_ptr(&local_ac8);
    pSVar9 = DataArray<soplex::SPxColId>::get_ptr((DataArray<soplex::SPxColId> *)(local_ae8 + 8));
    this_00 = (DataArray<soplex::SPxColId> *)local_ae8;
    (*(in_RDI->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x4b])
              (in_RDI,local_a50,pSVar6,pSVar7,pSVar8,pSVar9,local_ae8 + 4,this_00,&local_aec,
               &local_af0);
    if (local_a58 != (SPxRowId *)0x0) {
      local_a58 = DataArray<soplex::SPxRowId>::get_ptr(&local_a88);
      *in_stack_00000008 = local_ae8._4_4_;
    }
    if (local_a60 != (SPxColId *)0x0) {
      local_a60 = DataArray<soplex::SPxColId>::get_ptr(&local_aa0);
      *in_stack_00000010 = local_ae8._0_4_;
    }
    if (local_a68 != (SPxRowId *)0x0) {
      local_a68 = DataArray<soplex::SPxRowId>::get_ptr(&local_ac8);
      *in_stack_00000018 = local_aec;
    }
    if (local_a70 != (SPxColId *)0x0) {
      local_a70 = DataArray<soplex::SPxColId>::get_ptr
                            ((DataArray<soplex::SPxColId> *)(local_ae8 + 8));
      *in_stack_00000020 = local_af0;
    }
    DataArray<soplex::SPxColId>::~DataArray(this_00);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)this_00);
    DataArray<soplex::SPxColId>::~DataArray(this_00);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)this_00);
  }
  else {
    SVar3 = spxSense(in_RDI);
    if (SVar3 == MINIMIZE) {
      (**(code **)(*local_a50 + 0x228))(local_a50,1);
    }
    else {
      (**(code **)(*local_a50 + 0x228))(local_a50,0xffffffff);
    }
    nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x657437);
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowSetBase(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                   (int)in_stack_ffffffffffffb748);
    nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x657458);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                   (int)in_stack_ffffffffffffb748);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20));
    local_ca4 = 0;
    local_ca8 = 0;
    local_cac = 0;
    local_cb0 = 0;
    for (local_cb4 = 0; iVar14 = local_cb4,
        iVar4 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6574e2), iVar14 < iVar4; local_cb4 = local_cb4 + 1) {
      local_cbc = (DataKey)cId(in_stack_ffffffffffffb728,
                               (int)((ulong)in_stack_ffffffffffffb720 >> 0x20));
      local_a60[local_cb0].super_DataKey = local_cbc;
      local_cb0 = local_cb0 + 1;
      lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
      puVar10 = (ulong *)infinity();
      local_d48 = *puVar10 ^ 0x8000000000000000;
      local_a30 = local_d3c;
      local_a38 = &local_d48;
      local_a40 = 0;
      local_8 = local_a38;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                 in_stack_ffffffffffffb720);
      tVar1 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb718,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x657608);
      local_45f2 = false;
      if (tVar1) {
        upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
        local_a20 = infinity();
        local_a18 = local_dc8;
        local_a28 = 0;
        local_10 = local_a20;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                   in_stack_ffffffffffffb720);
        local_45f2 = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffb718,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6576b8);
      }
      if (local_45f2 == false) {
        lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
        puVar10 = (ulong *)infinity();
        local_fd8 = *puVar10 ^ 0x8000000000000000;
        local_a00 = local_fd0;
        local_a08 = &local_fd8;
        local_a10 = 0;
        local_18 = local_a08;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                   in_stack_ffffffffffffb720);
        tVar1 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb718,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6578ce);
        iVar14 = (int)((ulong)in_stack_ffffffffffffb718 >> 0x20);
        if (tVar1) {
          local_2d8 = upper(in_stack_ffffffffffffb720,iVar14);
          local_2d0 = local_1058;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
          tolerances(in_stack_ffffffffffffb718);
          peVar11 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x657964);
          Tolerances::epsilon(peVar11);
          bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_ffffffffffffb820,(double)in_stack_ffffffffffffb818);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x6579a3);
          if (bVar2) {
            SVar3 = spxSense(in_RDI);
            if (SVar3 == MINIMIZE) {
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              local_9f0 = infinity();
              local_9e8 = local_1168;
              local_9f8 = 0;
              local_20 = local_9f0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_11ec = 0;
              local_448 = local_11e8;
              local_450 = &local_11ec;
              local_458 = 0;
              local_200 = local_450;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_11f0 = 0;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                       in_stack_ffffffffffffb740,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb738,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
            }
            else {
              puVar10 = (ulong *)infinity();
              local_1278 = *puVar10 ^ 0x8000000000000000;
              local_9d0 = local_1270;
              local_9d8 = &local_1278;
              local_9e0 = 0;
              local_28 = local_9d8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              local_137c = 0;
              local_430 = local_1378;
              local_438 = &local_137c;
              local_440 = 0;
              local_208 = local_438;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_1380 = 0;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                       in_stack_ffffffffffffb740,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb738,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
            }
          }
          else {
            local_1408 = 0x3ff0000000000000;
            local_9b8 = local_1400;
            local_9c0 = &local_1408;
            local_9c8 = 0;
            local_30 = local_9c0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                       in_stack_ffffffffffffb720);
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20),
                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)in_stack_ffffffffffffb720);
            SVar3 = spxSense(in_RDI);
            iVar14 = (int)((ulong)in_stack_ffffffffffffb730 >> 0x20);
            if (SVar3 == MINIMIZE) {
              obj(in_stack_ffffffffffffb738,iVar14);
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              local_158c = 0;
              local_418 = local_1588;
              local_420 = &local_158c;
              local_428 = 0;
              local_210 = local_420;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_1590 = 0;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                       in_stack_ffffffffffffb740,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb738,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
              puVar10 = (ulong *)infinity();
              local_1618 = *puVar10 ^ 0x8000000000000000;
              local_9a0 = local_1610;
              local_9a8 = &local_1618;
              local_9b0 = 0;
              local_38 = local_9a8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_16a0 = 0;
              local_988 = local_1698;
              local_990 = &local_16a0;
              local_998 = 0;
              local_40 = local_990;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_16a4 = 0;
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740
                    ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffb738,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
            }
            else {
              obj(in_stack_ffffffffffffb738,iVar14);
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              local_1828 = 0;
              local_400 = local_1824;
              local_408 = &local_1828;
              local_410 = 0;
              local_218 = local_408;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_182c = 0;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                       in_stack_ffffffffffffb740,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb738,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
              local_18b8 = 0;
              local_970 = local_18ac;
              local_978 = &local_18b8;
              local_980 = 0;
              local_48 = local_978;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_960 = infinity();
              local_958 = local_1938;
              local_968 = 0;
              local_50 = local_960;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_193c = 0;
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740
                    ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffb738,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
            }
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x65815e);
            local_ca8 = local_ca8 + 1;
          }
        }
        else {
          upper(in_stack_ffffffffffffb720,iVar14);
          local_948 = infinity();
          local_940 = local_19bc;
          local_950 = 0;
          local_58 = local_948;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          tVar1 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffb718,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x658212);
          iVar14 = (int)((ulong)in_stack_ffffffffffffb718 >> 0x20);
          if (tVar1) {
            local_2c8 = lower(in_stack_ffffffffffffb720,iVar14);
            local_2c0 = local_1a3c;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
            tolerances(in_stack_ffffffffffffb718);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x6582a8);
            Tolerances::epsilon(peVar11);
            bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (in_stack_ffffffffffffb820,(double)in_stack_ffffffffffffb818);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x6582e7);
            if (bVar2) {
              SVar3 = spxSense(in_RDI);
              if (SVar3 == MINIMIZE) {
                puVar10 = (ulong *)infinity();
                local_1ad8 = *puVar10 ^ 0x8000000000000000;
                local_928 = local_1ad0;
                local_930 = &local_1ad8;
                local_938 = 0;
                local_60 = local_930;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                local_1bdc = 0;
                local_3e8 = local_1bd8;
                local_3f0 = &local_1bdc;
                local_3f8 = 0;
                local_220 = local_3f0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>
                          (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_1be0 = 0;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                         in_stack_ffffffffffffb740,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb738,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              }
              else {
                obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                local_918 = infinity();
                local_910 = local_1ce0;
                local_920 = 0;
                local_68 = local_918;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_1d64 = 0;
                local_3d0 = local_1d60;
                local_3d8 = &local_1d64;
                local_3e0 = 0;
                local_228 = local_3d8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>
                          (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_1d68 = 0;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                         in_stack_ffffffffffffb740,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb738,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              }
            }
            else {
              local_1df0 = 0x3ff0000000000000;
              local_8f8 = local_1de8;
              local_900 = &local_1df0;
              local_908 = 0;
              local_70 = local_900;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20),
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb720);
              SVar3 = spxSense(in_RDI);
              iVar14 = (int)((ulong)in_stack_ffffffffffffb730 >> 0x20);
              if (SVar3 == MINIMIZE) {
                obj(in_stack_ffffffffffffb738,iVar14);
                obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                local_1f74 = 0;
                local_3b8 = local_1f70;
                local_3c0 = &local_1f74;
                local_3c8 = 0;
                local_230 = local_3c0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>
                          (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_1f78 = 0;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                         in_stack_ffffffffffffb740,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb738,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
                local_2000 = 0;
                local_8e0 = local_1ff8;
                local_8e8 = &local_2000;
                local_8f0 = 0;
                local_78 = local_8e8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_8d0 = infinity();
                local_8c8 = local_2080;
                local_8d8 = 0;
                local_80 = local_8d0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_2084 = 0;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                      in_stack_ffffffffffffb740,
                      (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffb738,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              }
              else {
                obj(in_stack_ffffffffffffb738,iVar14);
                obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                local_2208 = 0;
                local_3a0 = local_2204;
                local_3a8 = &local_2208;
                local_3b0 = 0;
                local_238 = local_3a8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>
                          (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_220c = 0;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                         in_stack_ffffffffffffb740,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb738,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
                puVar10 = (ulong *)infinity();
                local_2298 = *puVar10 ^ 0x8000000000000000;
                local_8b0 = local_228c;
                local_8b8 = &local_2298;
                local_8c0 = 0;
                local_88 = local_8b8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_2320 = 0;
                local_898 = local_2318;
                local_8a0 = &local_2320;
                local_8a8 = 0;
                local_90 = local_8a0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                local_2324 = 0;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                      in_stack_ffffffffffffb740,
                      (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffb738,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              }
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x658aa2);
              local_ca8 = local_ca8 + 1;
            }
          }
          else {
            local_2b8 = lower(in_stack_ffffffffffffb720,iVar14);
            local_2b0 = local_23a4;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
            local_2a8 = upper(in_stack_ffffffffffffb720,
                              (int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
            local_2a0 = local_2424;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
            tolerances(in_stack_ffffffffffffb718);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x658b99);
            Tolerances::epsilon(peVar11);
            bVar2 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (in_stack_ffffffffffffb820,in_stack_ffffffffffffb818,
                               in_stack_ffffffffffffb810);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x658be0);
            if (bVar2) {
              local_298 = lower(in_stack_ffffffffffffb720,
                                (int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
              local_290 = local_24b8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
              tolerances(in_stack_ffffffffffffb718);
              peVar11 = std::
                        __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x658c6d);
              Tolerances::epsilon(peVar11);
              bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (in_stack_ffffffffffffb820,(double)in_stack_ffffffffffffb818);
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x658cac);
              if (bVar2) {
                local_2550 = 0x3ff0000000000000;
                local_880 = local_2548;
                local_888 = &local_2550;
                local_890 = 0;
                local_98 = local_888;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                           in_stack_ffffffffffffb720);
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)in_stack_ffffffffffffb720);
                SVar3 = spxSense(in_RDI);
                if (SVar3 == MINIMIZE) {
                  puVar10 = (ulong *)infinity();
                  local_25d8 = *puVar10 ^ 0x8000000000000000;
                  local_868 = local_25d0;
                  local_870 = &local_25d8;
                  local_878 = 0;
                  local_a0 = local_870;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                  local_26dc = 0;
                  local_388 = local_26d8;
                  local_390 = &local_26dc;
                  local_398 = 0;
                  local_240 = local_390;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_26e0 = 0;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20)
                           ,in_stack_ffffffffffffb740,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb738,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
                  puVar10 = (ulong *)infinity();
                  local_2768 = *puVar10 ^ 0x8000000000000000;
                  local_850 = local_2760;
                  local_858 = &local_2768;
                  local_860 = 0;
                  local_a8 = local_858;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_27f0 = 0;
                  local_838 = local_27e8;
                  local_840 = &local_27f0;
                  local_848 = 0;
                  local_b0 = local_840;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_27f4 = 0;
                  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                        in_stack_ffffffffffffb740,
                        (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                }
                else {
                  obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                  local_828 = infinity();
                  local_820 = local_28f4;
                  local_830 = 0;
                  local_b8 = local_828;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_2978 = 0;
                  local_370 = local_2974;
                  local_378 = &local_2978;
                  local_380 = 0;
                  local_248 = local_378;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_297c = 0;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20)
                           ,in_stack_ffffffffffffb740,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb738,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
                  local_2a08 = 0;
                  local_808 = local_29fc;
                  local_810 = &local_2a08;
                  local_818 = 0;
                  local_c0 = local_810;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_7f8 = infinity();
                  local_7f0 = local_2a88;
                  local_800 = 0;
                  local_c8 = local_7f8;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_2a8c = 0;
                  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                        in_stack_ffffffffffffb740,
                        (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb738,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                }
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x6592ad);
                local_ca8 = local_ca8 + 1;
              }
              else {
                local_288 = upper(in_stack_ffffffffffffb720,
                                  (int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
                local_280 = local_2b0c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb720,
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffb718);
                tolerances(in_stack_ffffffffffffb718);
                peVar11 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x659340);
                Tolerances::epsilon(peVar11);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                  (in_stack_ffffffffffffb820,(double)in_stack_ffffffffffffb818);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x65937f);
                if (bVar2) {
                  local_2ba8 = 0x3ff0000000000000;
                  local_7d8 = local_2ba0;
                  local_7e0 = &local_2ba8;
                  local_7e8 = 0;
                  local_d0 = local_7e0;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20)
                        ,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb720);
                  SVar3 = spxSense(in_RDI);
                  if (SVar3 == MINIMIZE) {
                    obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                    local_7c8 = infinity();
                    local_7c0 = local_2ca8;
                    local_7d0 = 0;
                    local_d8 = local_7c8;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_2d2c = 0;
                    local_358 = local_2d28;
                    local_360 = &local_2d2c;
                    local_368 = 0;
                    local_250 = local_360;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>
                              (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_2d30 = 0;
                    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::create(in_stack_ffffffffffffb750,
                             (int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                             in_stack_ffffffffffffb740,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffb738,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                    lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20))
                    ;
                    local_2db8 = 0;
                    local_7a8 = local_2db0;
                    local_7b0 = &local_2db8;
                    local_7b8 = 0;
                    local_e0 = local_7b0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_798 = infinity();
                    local_790 = local_2e38;
                    local_7a0 = 0;
                    local_e8 = local_798;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_2e3c = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  }
                  else {
                    puVar10 = (ulong *)infinity();
                    local_2ec8 = *puVar10 ^ 0x8000000000000000;
                    local_778 = local_2ebc;
                    local_780 = &local_2ec8;
                    local_788 = 0;
                    local_f0 = local_780;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                    local_2fcc = 0;
                    local_340 = local_2fc8;
                    local_348 = &local_2fcc;
                    local_350 = 0;
                    local_258 = local_348;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>
                              (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_2fd0 = 0;
                    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::create(in_stack_ffffffffffffb750,
                             (int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                             in_stack_ffffffffffffb740,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffb738,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                    lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20))
                    ;
                    puVar10 = (ulong *)infinity();
                    local_3058 = *puVar10 ^ 0x8000000000000000;
                    local_760 = local_3050;
                    local_768 = &local_3058;
                    local_770 = 0;
                    local_f8 = local_768;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_30e0 = 0;
                    local_748 = local_30d8;
                    local_750 = &local_30e0;
                    local_758 = 0;
                    local_100 = local_750;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_30e4 = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  }
                  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x65995a);
                  local_ca8 = local_ca8 + 1;
                }
                else {
                  obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                  obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
                  local_3268 = 0;
                  local_328 = local_3264;
                  local_330 = &local_3268;
                  local_338 = 0;
                  local_260 = local_330;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  local_326c = 0;
                  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20)
                           ,in_stack_ffffffffffffb740,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb738,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  local_32f8 = 0x3ff0000000000000;
                  local_730 = local_32ec;
                  local_738 = &local_32f8;
                  local_740 = 0;
                  local_108 = local_738;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                             in_stack_ffffffffffffb720);
                  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20)
                        ,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffb720);
                  SVar3 = spxSense(in_RDI);
                  iVar14 = (int)((ulong)in_stack_ffffffffffffb718 >> 0x20);
                  if (SVar3 == MINIMIZE) {
                    lower(in_stack_ffffffffffffb720,iVar14);
                    local_3380 = 0;
                    local_718 = local_3378;
                    local_720 = &local_3380;
                    local_728 = 0;
                    local_110 = local_720;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_708 = infinity();
                    local_700 = local_3400;
                    local_710 = 0;
                    local_118 = local_708;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_3404 = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                    upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20))
                    ;
                    puVar10 = (ulong *)infinity();
                    local_3490 = *puVar10 ^ 0x8000000000000000;
                    local_6e8 = local_3484;
                    local_6f0 = &local_3490;
                    local_6f8 = 0;
                    local_120 = local_6f0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_3518 = 0;
                    local_6d0 = local_3510;
                    local_6d8 = &local_3518;
                    local_6e0 = 0;
                    local_128 = local_6d8;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_351c = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  }
                  else {
                    lower(in_stack_ffffffffffffb720,iVar14);
                    puVar10 = (ulong *)infinity();
                    local_35a8 = *puVar10 ^ 0x8000000000000000;
                    local_6b8 = local_359c;
                    local_6c0 = &local_35a8;
                    local_6c8 = 0;
                    local_130 = local_6c0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_3630 = 0;
                    local_6a0 = local_3628;
                    local_6a8 = &local_3630;
                    local_6b0 = 0;
                    local_138 = local_6a8;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_3634 = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                    upper(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20))
                    ;
                    local_36c0 = 0;
                    local_688 = local_36b4;
                    local_690 = &local_36c0;
                    local_698 = 0;
                    local_140 = local_690;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_678 = infinity();
                    local_670 = local_3740;
                    local_680 = 0;
                    local_148 = local_678;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                               in_stack_ffffffffffffb720);
                    local_3744 = 0;
                    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,
                          in_stack_ffffffffffffb740,
                          (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffb738,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
                  }
                  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x65a024);
                  local_ca8 = local_ca8 + 2;
                }
              }
            }
            else {
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
              local_38c8 = 0;
              local_310 = local_38c4;
              local_318 = &local_38c8;
              local_320 = 0;
              local_268 = local_318;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_38cc = 0;
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                       in_stack_ffffffffffffb740,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb738,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              local_3958 = 0x3ff0000000000000;
              local_658 = local_394c;
              local_660 = &local_3958;
              local_668 = 0;
              local_150 = local_660;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20),
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb720);
              lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
              local_39dc = 0;
              local_2f8 = local_39d8;
              local_300 = &local_39dc;
              local_308 = 0;
              local_270 = local_300;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_648 = infinity();
              local_640 = local_3a5c;
              local_650 = 0;
              local_158 = local_648;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_3a60 = 0;
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740
                    ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffb738,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              lower(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
              puVar10 = (ulong *)infinity();
              local_3ae8 = *puVar10 ^ 0x8000000000000000;
              local_628 = local_3ae0;
              local_630 = &local_3ae8;
              local_638 = 0;
              local_160 = local_630;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_3b6c = 0;
              local_2e0 = local_3b68;
              local_2e8 = &local_3b6c;
              local_2f0 = 0;
              local_278 = local_2e8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                         in_stack_ffffffffffffb720);
              local_3b70 = 0;
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740
                    ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffb738,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x65a45a);
              local_ca8 = local_ca8 + 2;
            }
          }
        }
      }
      else {
        obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
        obj(in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20));
        local_f4c = 0;
        local_460 = local_f48;
        local_468 = &local_f4c;
        local_470 = 0;
        local_1f8 = local_468;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_ffffffffffffb730,(longlong)in_stack_ffffffffffffb728,
                   in_stack_ffffffffffffb720);
        local_f50 = 0;
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::create(in_stack_ffffffffffffb750,(int)((ulong)in_stack_ffffffffffffb748 >> 0x20),
                 in_stack_ffffffffffffb740,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffb738,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
      }
      local_ca4 = local_ca4 + 1;
    }
    (**(code **)(*local_a50 + 0x40))(local_a50,local_bb8,0);
    for (local_3b74 = 0; local_3b74 < local_cb0; local_3b74 = local_3b74 + 1) {
      local_3b7c = (DataKey)rId(in_stack_ffffffffffffb728,
                                (int)((ulong)in_stack_ffffffffffffb720 >> 0x20));
      local_a68[local_3b74].super_DataKey = local_3b7c;
    }
    *in_stack_00000010 = local_cb0;
    *in_stack_00000018 = local_cb0;
    for (local_3b80 = 0; iVar14 = local_3b80,
        iVar4 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x65a577), iVar14 < iVar4; local_3b80 = local_3b80 + 1) {
      TVar5 = rowType(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
      iVar14 = (int)((ulong)in_stack_ffffffffffffb720 >> 0x20);
      switch(TVar5) {
      case LESS_EQUAL:
        local_4224 = (DataKey)rId(in_stack_ffffffffffffb728,iVar14);
        local_a58[local_cac].super_DataKey = local_4224;
        local_cac = local_cac + 1;
        SVar3 = spxSense(in_RDI);
        iVar14 = (int)((ulong)in_stack_ffffffffffffb718 >> 0x20);
        if (SVar3 == MINIMIZE) {
          rhs(in_stack_ffffffffffffb720,iVar14);
          puVar10 = (ulong *)infinity();
          local_42b0 = *puVar10 ^ 0x8000000000000000;
          local_4f0 = local_42a4;
          local_4f8 = &local_42b0;
          local_500 = 0;
          local_1c8 = local_4f8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_4338 = 0;
          local_4d8 = local_4330;
          local_4e0 = &local_4338;
          local_4e8 = 0;
          local_1d0 = local_4e0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_433c = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        else {
          rhs(in_stack_ffffffffffffb720,iVar14);
          local_43c8 = 0;
          local_4c0 = local_43bc;
          local_4c8 = &local_43c8;
          local_4d0 = 0;
          local_1d8 = local_4c8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_4b0 = infinity();
          local_4a8 = local_4448;
          local_4b8 = 0;
          local_1e0 = local_4b0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_444c = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        break;
      case EQUAL:
        local_4454 = (DataKey)rId(in_stack_ffffffffffffb728,iVar14);
        local_a58[local_cac].super_DataKey = local_4454;
        local_cac = local_cac + 1;
        rhs(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
        puVar10 = (ulong *)infinity();
        local_44e0 = *puVar10 ^ 0x8000000000000000;
        local_490 = local_44d4;
        local_498 = &local_44e0;
        local_4a0 = 0;
        local_1e8 = local_498;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                   in_stack_ffffffffffffb720);
        rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
        local_480 = infinity();
        local_478 = local_4560;
        local_488 = 0;
        local_1f0 = local_480;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                   in_stack_ffffffffffffb720);
        local_4564 = 0;
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
              (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_ffffffffffffb738,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        break;
      case GREATER_EQUAL:
        local_3ff4 = (DataKey)rId(in_stack_ffffffffffffb728,iVar14);
        local_a58[local_cac].super_DataKey = local_3ff4;
        local_cac = local_cac + 1;
        SVar3 = spxSense(in_RDI);
        iVar14 = (int)((ulong)in_stack_ffffffffffffb718 >> 0x20);
        if (SVar3 == MINIMIZE) {
          lhs(in_stack_ffffffffffffb720,iVar14);
          local_4080 = 0;
          local_550 = local_4074;
          local_558 = &local_4080;
          local_560 = 0;
          local_1a8 = local_558;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_540 = infinity();
          local_538 = local_4100;
          local_548 = 0;
          local_1b0 = local_540;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_4104 = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        else {
          lhs(in_stack_ffffffffffffb720,iVar14);
          puVar10 = (ulong *)infinity();
          local_4190 = *puVar10 ^ 0x8000000000000000;
          local_520 = local_4184;
          local_528 = &local_4190;
          local_530 = 0;
          local_1b8 = local_528;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_4218 = 0;
          local_508 = local_4210;
          local_510 = &local_4218;
          local_518 = 0;
          local_1c0 = local_510;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_421c = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        break;
      case RANGE:
        SVar3 = spxSense(in_RDI);
        iVar14 = (int)((ulong)in_stack_ffffffffffffb720 >> 0x20);
        if (SVar3 == MINIMIZE) {
          local_3b88 = (DataKey)rId(in_stack_ffffffffffffb728,iVar14);
          local_a58[local_cac].super_DataKey = local_3b88;
          local_cac = local_cac + 1;
          lhs(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_3c10 = 0;
          local_610 = local_3c08;
          local_618 = &local_3c10;
          local_620 = 0;
          local_168 = local_618;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_600 = infinity();
          local_5f8 = local_3c90;
          local_608 = 0;
          local_170 = local_600;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_3c94 = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
          local_3c9c = (DataKey)rId(in_stack_ffffffffffffb728,
                                    (int)((ulong)in_stack_ffffffffffffb720 >> 0x20));
          local_a58[local_cac].super_DataKey = local_3c9c;
          local_cac = local_cac + 1;
          rhs(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          puVar10 = (ulong *)infinity();
          local_3d28 = *puVar10 ^ 0x8000000000000000;
          local_5e0 = local_3d1c;
          local_5e8 = &local_3d28;
          local_5f0 = 0;
          local_178 = local_5e8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_3db0 = 0;
          local_5c8 = local_3da8;
          local_5d0 = &local_3db0;
          local_5d8 = 0;
          local_180 = local_5d0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_3db4 = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        else {
          local_3dbc = (DataKey)rId(in_stack_ffffffffffffb728,iVar14);
          local_a58[local_cac].super_DataKey = local_3dbc;
          local_cac = local_cac + 1;
          lhs(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          puVar10 = (ulong *)infinity();
          local_3e48 = *puVar10 ^ 0x8000000000000000;
          local_5b0 = local_3e3c;
          local_5b8 = &local_3e48;
          local_5c0 = 0;
          local_188 = local_5b8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_3ed0 = 0;
          local_598 = local_3ec8;
          local_5a0 = &local_3ed0;
          local_5a8 = 0;
          local_190 = local_5a0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_3ed4 = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
          local_3edc = (DataKey)rId(in_stack_ffffffffffffb728,
                                    (int)((ulong)in_stack_ffffffffffffb720 >> 0x20));
          local_a58[local_cac].super_DataKey = local_3edc;
          local_cac = local_cac + 1;
          rhs(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_3f68 = 0;
          local_580 = local_3f5c;
          local_588 = &local_3f68;
          local_590 = 0;
          local_198 = local_588;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          rowVector(in_stack_ffffffffffffb720,(int)((ulong)in_stack_ffffffffffffb718 >> 0x20));
          local_570 = infinity();
          local_568 = local_3fe8;
          local_578 = 0;
          local_1a0 = local_570;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffb730,(double)in_stack_ffffffffffffb728,
                     in_stack_ffffffffffffb720);
          local_3fec = 0;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb750,in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffb738,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffb730,(int *)in_stack_ffffffffffffb728);
        }
        break;
      default:
        uVar12 = __cxa_allocate_exception(0x28);
        paVar15 = &local_4589;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4588,"XLPFRD01 This should never happen.",paVar15);
        SPxInternalCodeException::SPxInternalCodeException
                  ((SPxInternalCodeException *)in_stack_ffffffffffffb720,
                   (string *)in_stack_ffffffffffffb718);
        __cxa_throw(uVar12,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      }
    }
    (**(code **)(*local_a50 + 0x68))(local_a50,local_c80,0);
    for (local_4590 = 0; local_4590 < local_cac; local_4590 = local_4590 + 1) {
      DVar13 = (DataKey)cId(in_stack_ffffffffffffb728,
                            (int)((ulong)in_stack_ffffffffffffb720 >> 0x20));
      local_a70[local_4590].super_DataKey = DVar13;
    }
    *in_stack_00000008 = local_cac;
    *in_stack_00000020 = local_cac;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb720);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffb720);
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~LPRowSetBase(&in_stack_ffffffffffffb720->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}